

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O3

void lj_debug_dumpstack(lua_State *L,SBuf *sb,char *fmt,int depth)

{
  byte bVar1;
  uint64_t uVar2;
  long lVar3;
  int iVar4;
  cTValue *pcVar5;
  char *pcVar6;
  size_t sVar7;
  byte *pbVar8;
  GCfunc *fn;
  uint uVar9;
  byte *pbVar10;
  int size;
  char *name;
  uint local_70;
  int local_6c;
  lua_State *local_68;
  int local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  byte *local_50;
  cTValue *local_48;
  cTValue *local_40;
  char *local_38;
  
  uVar9 = 0xffffffff;
  if (depth < -1) {
    uVar9 = depth;
  }
  uVar9 = ~uVar9;
  local_58 = 0xffffffff;
  if (-1 < depth) {
    local_58 = depth;
  }
  if (local_58 != uVar9) {
    local_5c = depth >> 0x1f | 1;
    local_70 = 0;
    local_68 = L;
    local_60 = depth;
    local_50 = (byte *)fmt;
    do {
      pcVar5 = lj_debug_frame(local_68,uVar9,&local_6c);
      if (pcVar5 != (cTValue *)0x0) {
        local_48 = pcVar5 + local_6c;
        if ((long)local_6c == 0) {
          local_48 = (cTValue *)0x0;
        }
        fn = (GCfunc *)(pcVar5[-1].u64 & 0x7fffffffffff);
        pbVar10 = local_50;
        local_54 = uVar9;
        local_40 = pcVar5;
LAB_00112b41:
        while( true ) {
          bVar1 = *pbVar10;
          pbVar10 = pbVar10 + 1;
          if (0x65 < bVar1) goto code_r0x00112b54;
          if (bVar1 == 0x46) goto LAB_00112b8b;
          if (bVar1 != 0x5a) break;
          local_70 = *(int *)&sb->w - *(int *)&sb->b;
        }
        uVar9 = local_54;
        if (bVar1 != 0) goto LAB_00112ccc;
        goto LAB_00112d7e;
      }
      if (-1 < local_60) break;
      uVar9 = uVar9 - local_6c;
LAB_00112d7e:
      uVar9 = uVar9 + local_5c;
    } while (uVar9 != local_58);
    if (local_70 != 0) {
      sb->w = sb->b + local_70;
    }
  }
  return;
code_r0x00112b54:
  if (bVar1 == 0x70) goto LAB_00112b41;
  if (bVar1 != 0x6c) {
    if (bVar1 != 0x66) {
LAB_00112ccc:
      pbVar8 = (byte *)sb->w;
      if (*(int *)&sb->e == (int)pbVar8) {
        pbVar8 = (byte *)lj_buf_more2(sb,1);
      }
      *pbVar8 = bVar1;
      goto LAB_00112cd7;
    }
LAB_00112b8b:
    pcVar6 = lj_debug_funcname(local_68,local_40,&local_38);
    if (pcVar6 != (char *)0x0) {
      if ((bVar1 == 0x46) && ((fn->c).ffid == '\0')) {
        uVar2 = (fn->c).pc.ptr64;
        iVar4 = *(int *)(uVar2 - 0x20);
        if (iVar4 != -1) {
          debug_putchunkname(sb,*(GCproto **)(uVar2 - 0x28),iVar4);
          pcVar6 = sb->w;
          if (*(int *)&sb->e == (int)pcVar6) {
            pcVar6 = lj_buf_more2(sb,1);
          }
          *pcVar6 = ':';
          sb->w = pcVar6 + 1;
        }
      }
      pcVar6 = local_38;
      sVar7 = strlen(local_38);
      lj_buf_putmem(sb,pcVar6,(MSize)sVar7);
      goto LAB_00112b41;
    }
  }
  if ((fn->c).ffid == '\x01') {
    pcVar6 = sb->w;
    if (*(int *)&sb->e == (int)pcVar6) {
      pcVar6 = lj_buf_more2(sb,1);
    }
    *pcVar6 = '@';
    sb->w = pcVar6 + 1;
    lj_strfmt_putptr(sb,(fn->c).f);
    goto LAB_00112b41;
  }
  if ((fn->c).ffid == '\0') {
    lVar3 = *(long *)((long)fn + 0x20);
    iVar4 = debug_putchunkname(sb,*(GCproto **)(lVar3 + -0x28),*(int *)(lVar3 + -0x20));
    if (iVar4 != 0) {
      if (bVar1 == 0x6c) {
        iVar4 = debug_frameline(local_68,fn,local_48);
      }
      else {
        iVar4 = *(int *)(lVar3 + -0x20);
      }
      pcVar6 = sb->w;
      if (*(int *)&sb->e == (int)pcVar6) {
        pcVar6 = lj_buf_more2(sb,1);
      }
      *pcVar6 = ':';
      sb->w = pcVar6 + 1;
      if (iVar4 < 0) {
        iVar4 = *(int32_t *)(lVar3 + -0x20);
      }
      lj_strfmt_putint(sb,iVar4);
    }
    goto LAB_00112b41;
  }
  lj_buf_putmem(sb,"[builtin#",9);
  lj_strfmt_putint(sb,(uint)(fn->c).ffid);
  pbVar8 = (byte *)sb->w;
  if (*(int *)&sb->e == (int)pbVar8) {
    pbVar8 = (byte *)lj_buf_more2(sb,1);
  }
  *pbVar8 = 0x5d;
LAB_00112cd7:
  sb->w = (char *)(pbVar8 + 1);
  goto LAB_00112b41;
}

Assistant:

void lj_debug_dumpstack(lua_State *L, SBuf *sb, const char *fmt, int depth)
{
  int level = 0, dir = 1, pathstrip = 1;
  MSize lastlen = 0;
  if (depth < 0) { level = ~depth; depth = dir = -1; }  /* Reverse frames. */
  while (level != depth) {  /* Loop through all frame. */
    int size;
    cTValue *frame = lj_debug_frame(L, level, &size);
    if (frame) {
      cTValue *nextframe = size ? frame+size : NULL;
      GCfunc *fn = frame_func(frame);
      const uint8_t *p = (const uint8_t *)fmt;
      int c;
      while ((c = *p++)) {
	switch (c) {
	case 'p':  /* Preserve full path. */
	  pathstrip = 0;
	  break;
	case 'F': case 'f': {  /* Dump function name. */
	  const char *name;
	  const char *what = lj_debug_funcname(L, frame, &name);
	  if (what) {
	    if (c == 'F' && isluafunc(fn)) {  /* Dump module:name for 'F'. */
	      GCproto *pt = funcproto(fn);
	      if (pt->firstline != ~(BCLine)0) {  /* Not a bytecode builtin. */
		debug_putchunkname(sb, pt, pathstrip);
		lj_buf_putb(sb, ':');
	      }
	    }
	    lj_buf_putmem(sb, name, (MSize)strlen(name));
	    break;
	  }  /* else: can't derive a name, dump module:line. */
	  }
	  /* fallthrough */
	case 'l':  /* Dump module:line. */
	  if (isluafunc(fn)) {
	    GCproto *pt = funcproto(fn);
	    if (debug_putchunkname(sb, pt, pathstrip)) {
	      /* Regular Lua function. */
	      BCLine line = c == 'l' ? debug_frameline(L, fn, nextframe) :
				       pt->firstline;
	      lj_buf_putb(sb, ':');
	      lj_strfmt_putint(sb, line >= 0 ? line : pt->firstline);
	    }
	  } else if (isffunc(fn)) {  /* Dump numbered builtins. */
	    lj_buf_putmem(sb, "[builtin#", 9);
	    lj_strfmt_putint(sb, fn->c.ffid);
	    lj_buf_putb(sb, ']');
	  } else {  /* Dump C function address. */
	    lj_buf_putb(sb, '@');
	    lj_strfmt_putptr(sb, fn->c.f);
	  }
	  break;
	case 'Z':  /* Zap trailing separator. */
	  lastlen = sbuflen(sb);
	  break;
	default:
	  lj_buf_putb(sb, c);
	  break;
	}
      }
    } else if (dir == 1) {
      break;
    } else {
      level -= size;  /* Reverse frame order: quickly skip missing level. */
    }
    level += dir;
  }
  if (lastlen)
    sb->w = sb->b + lastlen;  /* Zap trailing separator. */
}